

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O2

void __thiscall OpenMD::Electrostatic::calcForce(Electrostatic *this,InteractionData *idat)

{
  RealType *t;
  Vector3d *this_00;
  Vector3d *v1;
  Vector3d *pVVar1;
  Vector3d *pVVar2;
  Vector3d *pVVar3;
  Mat3x3d *this_01;
  undefined8 uVar4;
  undefined8 uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  RealType RVar8;
  Vector3d *v1_00;
  byte bVar9;
  pointer piVar10;
  bool bVar11;
  RealType *t2;
  undefined4 uVar12;
  double dVar13;
  Vector<double,_3U> local_1a8;
  Vector<double,_3U> local_190;
  Vector3d *local_178;
  Vector3d *local_170;
  RectMatrix<double,_3U,_3U> local_168;
  Vector<double,_3U> local_120;
  Vector3d *local_108;
  Vector3d *local_100;
  Vector<double,_3U> local_f8;
  Vector3d *local_e0;
  Vector3d *local_d8;
  Vector3d *local_d0;
  Vector3d *local_c8;
  Vector3d *local_c0;
  Vector<double,_3U> local_b8;
  Vector3d *local_a0;
  Vector<double,_3U> local_98;
  Vector<double,_3U> local_80;
  double local_68;
  RealType local_60;
  Vector3d *local_58;
  Vector3d *local_50;
  Vector<double,_3U> local_48;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar10 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)piVar10[idat->atid1] == -1) {
    bVar11 = false;
    uVar12 = 0;
  }
  else {
    ElectrostaticAtomData::operator=
              (&this->data1,
               (this->ElectrostaticMap).
               super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
               ._M_impl.super__Vector_impl_data._M_start + piVar10[idat->atid1]);
    uVar4._0_1_ = (this->data1).is_Charge;
    uVar4._1_1_ = (this->data1).is_Dipole;
    uVar4._2_1_ = (this->data1).is_Quadrupole;
    uVar4._3_1_ = (this->data1).is_Fluctuating;
    uVar4._4_1_ = (this->data1).uses_SlaterIntramolecular;
    uVar4._5_3_ = *(undefined3 *)&(this->data1).field_0x5;
    uVar12 = (undefined4)uVar4;
    bVar11 = (this->data1).uses_SlaterIntramolecular;
    piVar10 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  this->a_is_Charge = (bool)(char)uVar12;
  this->a_is_Dipole = (bool)(char)((uint)uVar12 >> 8);
  this->a_is_Quadrupole = (bool)(char)((uint)uVar12 >> 0x10);
  this->a_is_Fluctuating = (bool)(char)((uint)uVar12 >> 0x18);
  this->a_uses_SlaterIntra = bVar11;
  t2 = (RealType *)(long)idat->atid2;
  if ((long)piVar10[(long)t2] == -1) {
    bVar11 = false;
    uVar12 = 0;
  }
  else {
    ElectrostaticAtomData::operator=
              (&this->data2,
               (this->ElectrostaticMap).
               super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
               ._M_impl.super__Vector_impl_data._M_start + piVar10[(long)t2]);
    uVar5._0_1_ = (this->data2).is_Charge;
    uVar5._1_1_ = (this->data2).is_Dipole;
    uVar5._2_1_ = (this->data2).is_Quadrupole;
    uVar5._3_1_ = (this->data2).is_Fluctuating;
    uVar5._4_1_ = (this->data2).uses_SlaterIntramolecular;
    uVar5._5_3_ = *(undefined3 *)&(this->data2).field_0x5;
    uVar12 = (undefined4)uVar5;
    bVar11 = (this->data2).uses_SlaterIntramolecular;
  }
  this->b_is_Charge = (bool)(char)uVar12;
  this->b_is_Dipole = (bool)(char)((uint)uVar12 >> 8);
  this->b_is_Quadrupole = (bool)(char)((uint)uVar12 >> 0x10);
  this->b_is_Fluctuating = (bool)(char)((uint)uVar12 >> 0x18);
  this->b_uses_SlaterIntra = bVar11;
  this->U = 0.0;
  this_00 = &this->F;
  Vector<double,_3U>::zero(&this_00->super_Vector<double,_3U>);
  local_108 = &this->Ta;
  Vector<double,_3U>::zero(&local_108->super_Vector<double,_3U>);
  local_170 = &this->Tb;
  Vector<double,_3U>::zero(&local_170->super_Vector<double,_3U>);
  local_d8 = &this->Ea;
  Vector<double,_3U>::zero(&local_d8->super_Vector<double,_3U>);
  local_d0 = &this->Eb;
  Vector<double,_3U>::zero(&local_d0->super_Vector<double,_3U>);
  local_e0 = &this->indirect_F;
  this->dUdCa = 0.0;
  this->dUdCb = 0.0;
  this->Pa = 0.0;
  this->Pb = 0.0;
  this->indirect_Pot = 0.0;
  Vector<double,_3U>::zero(&local_e0->super_Vector<double,_3U>);
  local_c8 = &this->indirect_Ta;
  Vector<double,_3U>::zero(&local_c8->super_Vector<double,_3U>);
  local_c0 = &this->indirect_Tb;
  Vector<double,_3U>::zero(&local_c0->super_Vector<double,_3U>);
  this->excluded_Pot = 0.0;
  dVar13 = 1.0 / idat->rij;
  this->ri = dVar13;
  operator*((Vector<double,_3U> *)&local_168,&(idat->d).super_Vector<double,_3U>,dVar13);
  v1 = &this->rhat;
  Vector3<double>::operator=(v1,(Vector<double,_3U> *)&local_168);
  if (((this->a_uses_SlaterIntra != false) || (this->b_uses_SlaterIntra == true)) &&
     (idat->excluded == true)) {
    t2 = (RealType *)
         (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->J).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)*(int *)((long)t2 + (long)idat->atid2 * 4) * 0x10 +
               *(long *)&(this->Jij).
                         super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)t2 + (long)idat->atid1 * 4)].
                         super__Vector_base<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
                         ._M_impl.super__Vector_impl_data));
  }
  t = &idat->rij;
  if ((this->a_is_Charge != false) || (this->b_is_Charge == true)) {
    t2 = &this->dv01;
    CubicSpline::getValueAndDerivativeAt
              ((this->v01s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v01,t2);
  }
  if ((this->a_is_Dipole != false) || (this->b_is_Dipole == true)) {
    t2 = &this->dv11;
    CubicSpline::getValueAndDerivativeAt
              ((this->v11s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v11,t2);
    this->v11or = this->ri * this->v11;
  }
  if (((this->a_is_Quadrupole != false) || (this->b_is_Quadrupole != false)) ||
     ((bVar9 = this->a_is_Dipole, (bool)bVar9 == true && (this->b_is_Dipole == true)))) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v21s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v21,&this->dv21);
    t2 = &this->dv22;
    CubicSpline::getValueAndDerivativeAt
              ((this->v22s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v22,t2);
    this->v22or = this->ri * this->v22;
    bVar9 = this->a_is_Dipole;
  }
  if ((((bVar9 & 1) != 0) && (this->b_is_Quadrupole != false)) ||
     ((bVar9 = this->a_is_Quadrupole, this->b_is_Dipole == true && ((bVar9 & 1) != 0)))) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v31s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v31,&this->dv31);
    t2 = &this->dv32;
    CubicSpline::getValueAndDerivativeAt
              ((this->v32s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v32,t2);
    this->v31or = this->ri * this->v31;
    this->v32or = this->v32 * this->ri;
    bVar9 = this->a_is_Quadrupole;
  }
  if (((bVar9 & 1) != 0) && (this->b_is_Quadrupole == true)) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v41s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v41,&this->dv41);
    CubicSpline::getValueAndDerivativeAt
              ((this->v42s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v42,&this->dv42);
    t2 = &this->dv43;
    CubicSpline::getValueAndDerivativeAt
              ((this->v43s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v43,t2);
    this->v42or = this->ri * this->v42;
    this->v43or = this->v43 * this->ri;
  }
  if (this->a_is_Charge == true) {
    dVar13 = (this->data1).fixedCharge;
    this->C_a = dVar13;
    if (this->a_is_Fluctuating == true) {
      dVar13 = dVar13 + idat->flucQ1;
      this->C_a = dVar13;
    }
    if (idat->excluded == true) {
      idat->skippedCharge2 = dVar13 + idat->skippedCharge2;
    }
    else {
      operator*((Vector<double,_3U> *)&local_168,dVar13 * this->pre11_ * this->dv01,
                &v1->super_Vector<double,_3U>);
      Vector<double,_3U>::sub(&local_d0->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      this->Pb = this->C_a * this->pre11_ * this->v01 + this->Pb;
    }
  }
  if (this->a_is_Dipole == true) {
    pVVar1 = &idat->D_1;
    dVar13 = dot<double,3u>(&v1->super_Vector<double,_3U>,&pVVar1->super_Vector<double,_3U>);
    this->rdDa = dVar13;
    cross<double>((Vector3<double> *)&local_168,v1,pVVar1);
    Vector<double,_3U>::operator=
              (&(this->rxDa).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if (idat->excluded == false) {
      dVar13 = this->pre12_;
      operator*(&local_190,(this->dv11 - this->v11or) * this->rdDa,&v1->super_Vector<double,_3U>);
      operator*(&local_120,this->v11or,&pVVar1->super_Vector<double,_3U>);
      OpenMD::operator+(&local_1a8,&local_190,&local_120);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::sub(&local_d0->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      this->Pb = this->pre12_ * this->v11 * this->rdDa + this->Pb;
    }
  }
  if (this->a_is_Quadrupole == true) {
    this->trQa = (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0] + (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[1][1] +
                 (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [2];
    operator*((Vector<double,_3U> *)&local_168,(RectMatrix<double,_3U,_3U> *)&idat->Q_1,
              &v1->super_Vector<double,_3U>);
    pVVar1 = &this->Qar;
    Vector3<double>::operator=(pVVar1,(Vector<double,_3U> *)&local_168);
    operator*((Vector<double,_3U> *)&local_168,&v1->super_Vector<double,_3U>,
              (RectMatrix<double,_3U,_3U> *)&idat->Q_1);
    Vector3<double>::operator=(&this->rQa,(Vector<double,_3U> *)&local_168);
    dVar13 = dot<double,3u>(&v1->super_Vector<double,_3U>,&pVVar1->super_Vector<double,_3U>);
    this->rdQar = dVar13;
    cross<double>((Vector3<double> *)&local_168,v1,pVVar1);
    Vector<double,_3U>::operator=
              (&(this->rxQar).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if (idat->excluded == false) {
      dVar13 = this->pre14_;
      operator*(&local_f8,this->trQa,&v1->super_Vector<double,_3U>);
      operator*(&local_120,&local_f8,this->dv21);
      operator*(&local_98,2.0,&pVVar1->super_Vector<double,_3U>);
      operator*(&local_b8,&local_98,this->v22or);
      OpenMD::operator+(&local_190,&local_120,&local_b8);
      operator*(&local_48,this->rdQar,&v1->super_Vector<double,_3U>);
      operator*(&local_80,&local_48,this->dv22 - (this->v22or + this->v22or));
      OpenMD::operator+(&local_1a8,&local_190,&local_80);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::sub(&local_d0->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      this->Pb = (this->v21 * this->trQa + this->v22 * this->rdQar) * this->pre14_ + this->Pb;
    }
  }
  if (this->b_is_Charge == true) {
    dVar13 = (this->data2).fixedCharge;
    this->C_b = dVar13;
    if (this->b_is_Fluctuating == true) {
      dVar13 = dVar13 + idat->flucQ2;
      this->C_b = dVar13;
    }
    if (idat->excluded == true) {
      idat->skippedCharge1 = dVar13 + idat->skippedCharge1;
    }
    else {
      operator*((Vector<double,_3U> *)&local_168,dVar13 * this->pre11_ * this->dv01,
                &v1->super_Vector<double,_3U>);
      Vector<double,_3U>::add(&local_d8->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      this->Pa = this->C_b * this->pre11_ * this->v01 + this->Pa;
    }
  }
  if (this->b_is_Dipole == true) {
    pVVar1 = &idat->D_2;
    dVar13 = dot<double,3u>(&v1->super_Vector<double,_3U>,&pVVar1->super_Vector<double,_3U>);
    this->rdDb = dVar13;
    cross<double>((Vector3<double> *)&local_168,v1,pVVar1);
    Vector<double,_3U>::operator=
              (&(this->rxDb).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if (idat->excluded == false) {
      dVar13 = this->pre12_;
      operator*(&local_190,(this->dv11 - this->v11or) * this->rdDb,&v1->super_Vector<double,_3U>);
      operator*(&local_120,this->v11or,&pVVar1->super_Vector<double,_3U>);
      OpenMD::operator+(&local_1a8,&local_190,&local_120);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&local_d8->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      this->Pa = this->pre12_ * this->v11 * this->rdDb + this->Pa;
    }
  }
  if (this->b_is_Quadrupole == true) {
    this->trQb = (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0] + (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[1][1] +
                 (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                 [2];
    operator*((Vector<double,_3U> *)&local_168,(RectMatrix<double,_3U,_3U> *)&idat->Q_2,
              &v1->super_Vector<double,_3U>);
    pVVar1 = &this->Qbr;
    Vector3<double>::operator=(pVVar1,(Vector<double,_3U> *)&local_168);
    operator*((Vector<double,_3U> *)&local_168,&v1->super_Vector<double,_3U>,
              (RectMatrix<double,_3U,_3U> *)&idat->Q_2);
    Vector3<double>::operator=(&this->rQb,(Vector<double,_3U> *)&local_168);
    dVar13 = dot<double,3u>(&v1->super_Vector<double,_3U>,&pVVar1->super_Vector<double,_3U>);
    this->rdQbr = dVar13;
    cross<double>((Vector3<double> *)&local_168,v1,pVVar1);
    Vector<double,_3U>::operator=
              (&(this->rxQbr).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if (idat->excluded == false) {
      dVar13 = this->pre14_;
      operator*(&local_f8,this->trQb,&v1->super_Vector<double,_3U>);
      operator*(&local_120,&local_f8,this->dv21);
      operator*(&local_98,2.0,&pVVar1->super_Vector<double,_3U>);
      operator*(&local_b8,&local_98,this->v22or);
      OpenMD::operator+(&local_190,&local_120,&local_b8);
      operator*(&local_48,this->rdQbr,&v1->super_Vector<double,_3U>);
      operator*(&local_80,&local_48,this->dv22 - (this->v22or + this->v22or));
      OpenMD::operator+(&local_1a8,&local_190,&local_80);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&local_d8->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      this->Pa = (this->v21 * this->trQb + this->v22 * this->rdQbr) * this->pre14_ + this->Pa;
    }
  }
  if (this->a_is_Charge != true) goto LAB_00233892;
  if (this->b_is_Charge == true) {
    dVar13 = this->pre11_ * idat->electroMult;
    this->pref = dVar13;
    dVar13 = this->C_a * this->C_b * dVar13;
    this->U = this->v01 * dVar13 + this->U;
    operator*((Vector<double,_3U> *)&local_168,dVar13 * this->dv01,&v1->super_Vector<double,_3U>);
    Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
      dVar13 = this->preRF_ * this->pref * this->C_a * this->C_b * idat->r2;
      this->rfContrib = dVar13;
      this->indirect_Pot = this->indirect_Pot + dVar13;
      operator*((Vector<double,_3U> *)&local_168,(dVar13 + dVar13) * this->ri,
                &v1->super_Vector<double,_3U>);
      Vector<double,_3U>::add(&local_e0->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    }
    if (idat->excluded == true) {
      if ((this->a_uses_SlaterIntra != false) || (this->b_uses_SlaterIntra == true)) {
        RVar8 = CubicSpline::getValueAt
                          ((this->J).
                           super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,t);
        this->coulInt = RVar8;
        this->excluded_Pot = this->C_a * this->C_b * RVar8 + this->excluded_Pot;
        if (this->a_is_Fluctuating == true) {
          this->dUdCa = this->C_b * RVar8 + this->dUdCa;
        }
        if (this->b_is_Fluctuating == true) {
          dVar13 = this->C_a * RVar8;
          goto LAB_00233445;
        }
      }
    }
    else {
      if (this->a_is_Fluctuating == true) {
        this->dUdCa = this->C_b * this->pref * this->v01 + this->dUdCa;
      }
      if (this->b_is_Fluctuating == true) {
        dVar13 = this->C_a * this->pref * this->v01;
LAB_00233445:
        this->dUdCb = dVar13 + this->dUdCb;
      }
    }
  }
  if (this->b_is_Dipole == true) {
    dVar13 = this->pre12_ * idat->electroMult;
    this->pref = dVar13;
    dVar13 = dVar13 * this->C_a;
    this->U = this->v11 * dVar13 * this->rdDb + this->U;
    operator*(&local_190,(this->dv11 - this->v11or) * this->rdDb,&v1->super_Vector<double,_3U>);
    operator*(&local_120,this->v11or,&(idat->D_2).super_Vector<double,_3U>);
    OpenMD::operator+(&local_1a8,&local_190,&local_120);
    operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
    Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    operator*((Vector<double,_3U> *)&local_168,this->C_a * this->pref * this->v11,
              &(this->rxDb).super_Vector<double,_3U>);
    Vector<double,_3U>::add(&local_170->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if (this->a_is_Fluctuating == true) {
      this->dUdCa = this->pref * this->v11 * this->rdDb + this->dUdCa;
    }
    if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
      dVar13 = this->C_a * this->pref * this->preRF_;
      dVar13 = (dVar13 + dVar13) * *t;
      this->rfContrib = dVar13;
      this->indirect_Pot = this->rdDb * dVar13 + this->indirect_Pot;
      operator*(&local_1a8,dVar13,&(idat->D_2).super_Vector<double,_3U>);
      operator/((Vector<double,_3U> *)&local_168,&local_1a8,*t);
      Vector<double,_3U>::add(&local_e0->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      operator*((Vector<double,_3U> *)&local_168,this->C_a * this->pref * this->preRF_,
                &(this->rxDb).super_Vector<double,_3U>);
      Vector<double,_3U>::add(&local_c0->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    }
  }
  if (this->b_is_Quadrupole == true) {
    dVar13 = this->pre14_ * idat->electroMult;
    this->pref = dVar13;
    dVar13 = dVar13 * this->C_a;
    this->U = (this->v21 * this->trQb + this->v22 * this->rdQbr) * dVar13 + this->U;
    operator*(&local_190,this->trQb * this->dv21,&v1->super_Vector<double,_3U>);
    operator*(&local_f8,2.0,&(this->Qbr).super_Vector<double,_3U>);
    operator*(&local_120,&local_f8,this->v22or);
    OpenMD::operator+(&local_1a8,&local_190,&local_120);
    operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
    Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    operator*(&local_1a8,this->C_a * this->pref * this->rdQbr,&v1->super_Vector<double,_3U>);
    operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->dv22 - (this->v22or + this->v22or));
    Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    dVar13 = this->C_a * this->pref;
    operator*(&local_1a8,dVar13 + dVar13,&(this->rxQbr).super_Vector<double,_3U>);
    operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v22);
    Vector<double,_3U>::add(&local_170->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if (this->a_is_Fluctuating == true) {
      this->dUdCa = (this->v21 * this->trQb + this->v22 * this->rdQbr) * this->pref + this->dUdCa;
    }
  }
LAB_00233892:
  if (this->a_is_Dipole == true) {
    if (this->b_is_Charge == true) {
      dVar13 = this->pre12_ * idat->electroMult;
      this->pref = dVar13;
      dVar13 = dVar13 * this->C_b;
      this->U = this->U - this->v11 * dVar13 * this->rdDa;
      operator*(&local_190,(this->dv11 - this->v11or) * this->rdDa,&v1->super_Vector<double,_3U>);
      operator*(&local_120,this->v11or,&(idat->D_1).super_Vector<double,_3U>);
      OpenMD::operator+(&local_1a8,&local_190,&local_120);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::sub(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      operator*((Vector<double,_3U> *)&local_168,this->C_b * this->pref * this->v11,
                &(this->rxDa).super_Vector<double,_3U>);
      Vector<double,_3U>::sub(&local_108->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
      if (this->b_is_Fluctuating == true) {
        this->dUdCb = this->dUdCb - this->v11 * this->pref * this->rdDa;
      }
      if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
        dVar13 = this->C_b * this->pref * this->preRF_;
        dVar13 = (dVar13 + dVar13) * *t;
        this->rfContrib = dVar13;
        this->indirect_Pot = this->indirect_Pot - this->rdDa * dVar13;
        operator*(&local_1a8,dVar13,&(idat->D_1).super_Vector<double,_3U>);
        operator/((Vector<double,_3U> *)&local_168,&local_1a8,*t);
        Vector<double,_3U>::sub
                  (&local_e0->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
        operator*((Vector<double,_3U> *)&local_168,this->C_b * this->pref * this->preRF_,
                  &(this->rxDa).super_Vector<double,_3U>);
        Vector<double,_3U>::sub
                  (&local_c8->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      }
    }
    if (this->b_is_Dipole == true) {
      this->pref = this->pre22_ * idat->electroMult;
      pVVar1 = &idat->D_1;
      pVVar2 = &idat->D_2;
      dVar13 = dot<double,3u>(&pVVar1->super_Vector<double,_3U>,&pVVar2->super_Vector<double,_3U>);
      this->DadDb = dVar13;
      cross<double>((Vector3<double> *)&local_168,pVVar1,pVVar2);
      pVVar3 = &this->DaxDb;
      Vector<double,_3U>::operator=
                (&pVVar3->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      this->U = this->U - (this->v21 * this->DadDb + this->rdDa * this->rdDb * this->v22) * dVar13;
      operator*(&local_190,this->DadDb * this->dv21,&v1->super_Vector<double,_3U>);
      dVar6 = this->v22or;
      operator*(&local_b8,this->rdDb,&pVVar1->super_Vector<double,_3U>);
      operator*(&local_98,this->rdDa,&pVVar2->super_Vector<double,_3U>);
      OpenMD::operator+(&local_f8,&local_b8,&local_98);
      operator*(&local_120,dVar6,&local_f8);
      OpenMD::operator+(&local_1a8,&local_190,&local_120);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::sub(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      operator*((Vector<double,_3U> *)&local_168,
                (this->dv22 - (this->v22or + this->v22or)) * this->rdDa * this->rdDb * this->pref,
                &v1->super_Vector<double,_3U>);
      Vector<double,_3U>::sub(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      operator*(&local_190,this->v21,&pVVar3->super_Vector<double,_3U>);
      operator*(&local_120,this->v22 * this->rdDb,&(this->rxDa).super_Vector<double,_3U>);
      operator-(&local_1a8,&local_190,&local_120);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&local_108->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
      dVar13 = this->pref;
      operator*(&local_190,-this->v21,&pVVar3->super_Vector<double,_3U>);
      operator*(&local_120,this->v22 * this->rdDa,&(this->rxDb).super_Vector<double,_3U>);
      operator-(&local_1a8,&local_190,&local_120);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&local_170->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
      if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
        dVar13 = -this->pref * this->preRF_;
        dVar13 = dVar13 + dVar13;
        this->rfContrib = dVar13;
        this->indirect_Pot = this->DadDb * dVar13 + this->indirect_Pot;
        operator*((Vector<double,_3U> *)&local_168,dVar13,&pVVar3->super_Vector<double,_3U>);
        Vector<double,_3U>::add
                  (&local_c8->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
        operator*((Vector<double,_3U> *)&local_168,this->rfContrib,&pVVar3->super_Vector<double,_3U>
                 );
        Vector<double,_3U>::sub
                  (&local_c0->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      }
    }
    if (this->b_is_Quadrupole == true) {
      this->pref = this->pre24_ * idat->electroMult;
      pVVar1 = &idat->D_1;
      operator*((Vector<double,_3U> *)&local_168,&pVVar1->super_Vector<double,_3U>,
                (RectMatrix<double,_3U,_3U> *)&idat->Q_2);
      pVVar2 = &this->DadQb;
      Vector3<double>::operator=(pVVar2,(Vector<double,_3U> *)&local_168);
      dVar13 = dot<double,3u>(&pVVar1->super_Vector<double,_3U>,
                              &(this->Qbr).super_Vector<double,_3U>);
      this->DadQbr = dVar13;
      cross<double>((Vector3<double> *)&local_168,pVVar1,&this->Qbr);
      pVVar3 = &this->DaxQbr;
      Vector<double,_3U>::operator=
                (&pVVar3->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      this->U = this->U - ((this->trQb * this->rdDa + this->DadQbr + this->DadQbr) * this->v31 +
                          this->rdDa * this->rdQbr * this->v32) * dVar13;
      operator*(&local_120,this->trQb,&pVVar1->super_Vector<double,_3U>);
      operator*(&local_f8,2.0,&pVVar2->super_Vector<double,_3U>);
      OpenMD::operator+(&local_190,&local_120,&local_f8);
      operator*(&local_1a8,dVar13,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v31or);
      Vector<double,_3U>::sub(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      operator*((Vector<double,_3U> *)&local_168,
                (this->dv31 - this->v31or) *
                (this->trQb * this->rdDa + this->DadQbr + this->DadQbr) * this->pref,
                &v1->super_Vector<double,_3U>);
      Vector<double,_3U>::sub(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      operator*(&local_120,&pVVar1->super_Vector<double,_3U>,this->rdQbr);
      operator*(&local_f8,this->rdDa + this->rdDa,&(this->rQb).super_Vector<double,_3U>);
      OpenMD::operator+(&local_190,&local_120,&local_f8);
      operator*(&local_1a8,dVar13,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v32or);
      Vector<double,_3U>::sub(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      operator*(&local_190,this->rdDa * this->rdQbr,&v1->super_Vector<double,_3U>);
      operator*(&local_1a8,&local_190,this->v32or * -3.0 + this->dv32);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::sub(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      operator*(&local_f8,-this->trQb,&(this->rxDa).super_Vector<double,_3U>);
      operator*(&local_b8,2.0,&pVVar3->super_Vector<double,_3U>);
      OpenMD::operator+(&local_120,&local_f8,&local_b8);
      operator*(&local_190,&local_120,this->v31);
      operator*(&local_80,&(this->rxDa).super_Vector<double,_3U>,this->rdQbr);
      operator*(&local_98,&local_80,this->v32);
      operator-(&local_1a8,&local_190,&local_98);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&local_108->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
      dVar13 = this->pref;
      cross<double>((Vector3<double> *)&local_b8,pVVar2,v1);
      operator*(&local_f8,2.0,&local_b8);
      operator*(&local_98,2.0,&pVVar3->super_Vector<double,_3U>);
      operator-(&local_120,&local_f8,&local_98);
      operator*(&local_190,&local_120,this->v31);
      operator*(&local_48,this->rdDa + this->rdDa,&(this->rxQbr).super_Vector<double,_3U>);
      operator*(&local_80,&local_48,this->v32);
      operator-(&local_1a8,&local_190,&local_80);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&local_170->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
    }
  }
  if (this->a_is_Quadrupole == true) {
    if (this->b_is_Charge == true) {
      dVar13 = this->pre14_ * idat->electroMult;
      this->pref = dVar13;
      dVar13 = dVar13 * this->C_b;
      this->U = (this->v21 * this->trQa + this->v22 * this->rdQar) * dVar13 + this->U;
      operator*(&local_120,this->trQa,&v1->super_Vector<double,_3U>);
      operator*(&local_190,&local_120,this->dv21);
      operator*(&local_b8,2.0,&(this->Qar).super_Vector<double,_3U>);
      operator*(&local_f8,&local_b8,this->v22or);
      OpenMD::operator+(&local_1a8,&local_190,&local_f8);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      operator*(&local_1a8,this->C_b * this->pref * this->rdQar,&v1->super_Vector<double,_3U>);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->dv22 - (this->v22or + this->v22or)
               );
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->C_b * this->pref;
      operator*(&local_1a8,dVar13 + dVar13,&(this->rxQar).super_Vector<double,_3U>);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v22);
      Vector<double,_3U>::add(&local_108->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
      if (this->b_is_Fluctuating == true) {
        this->dUdCb = (this->v21 * this->trQa + this->v22 * this->rdQar) * this->pref + this->dUdCb;
      }
    }
    if (this->b_is_Dipole == true) {
      this->pref = this->pre24_ * idat->electroMult;
      pVVar1 = &idat->D_2;
      operator*((Vector<double,_3U> *)&local_168,&pVVar1->super_Vector<double,_3U>,
                (RectMatrix<double,_3U,_3U> *)&idat->Q_1);
      pVVar2 = &this->DbdQa;
      Vector3<double>::operator=(pVVar2,(Vector<double,_3U> *)&local_168);
      dVar13 = dot<double,3u>(&pVVar1->super_Vector<double,_3U>,
                              &(this->Qar).super_Vector<double,_3U>);
      this->DbdQar = dVar13;
      cross<double>((Vector3<double> *)&local_168,pVVar1,&this->Qar);
      pVVar3 = &this->DbxQar;
      Vector<double,_3U>::operator=
                (&pVVar3->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      local_178 = (Vector3d *)this->pref;
      this->U = ((this->trQa * this->rdDb + this->DbdQar + this->DbdQar) * this->v31 +
                this->rdDb * this->rdQar * this->v32) * (double)local_178 + this->U;
      operator*(&local_120,this->trQa,&pVVar1->super_Vector<double,_3U>);
      operator*(&local_f8,2.0,&pVVar2->super_Vector<double,_3U>);
      OpenMD::operator+(&local_190,&local_120,&local_f8);
      operator*(&local_1a8,(double)local_178,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v31or);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      operator*((Vector<double,_3U> *)&local_168,
                (this->dv31 - this->v31or) *
                (this->trQa * this->rdDb + this->DbdQar + this->DbdQar) * this->pref,
                &v1->super_Vector<double,_3U>);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      local_178 = (Vector3d *)this->pref;
      operator*(&local_120,&pVVar1->super_Vector<double,_3U>,this->rdQar);
      operator*(&local_f8,this->rdDb + this->rdDb,&(this->rQa).super_Vector<double,_3U>);
      OpenMD::operator+(&local_190,&local_120,&local_f8);
      operator*(&local_1a8,(double)local_178,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v32or);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      operator*(&local_190,this->rdDb * this->rdQar,&v1->super_Vector<double,_3U>);
      operator*(&local_1a8,&local_190,this->v32or * -3.0 + this->dv32);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      cross<double>((Vector3<double> *)&local_b8,pVVar2,v1);
      operator*(&local_f8,-2.0,&local_b8);
      operator*(&local_98,2.0,&pVVar3->super_Vector<double,_3U>);
      OpenMD::operator+(&local_120,&local_f8,&local_98);
      operator*(&local_190,&local_120,this->v31);
      operator*(&local_48,this->rdDb + this->rdDb,&(this->rxQar).super_Vector<double,_3U>);
      operator*(&local_80,&local_48,this->v32);
      OpenMD::operator+(&local_1a8,&local_190,&local_80);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&local_108->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
      dVar13 = this->pref;
      operator*(&local_f8,this->trQa,&(this->rxDb).super_Vector<double,_3U>);
      operator*(&local_b8,2.0,&pVVar3->super_Vector<double,_3U>);
      operator-(&local_120,&local_f8,&local_b8);
      operator*(&local_190,&local_120,this->v31);
      operator*(&local_80,&(this->rxDb).super_Vector<double,_3U>,this->rdQar);
      operator*(&local_98,&local_80,this->v32);
      OpenMD::operator+(&local_1a8,&local_190,&local_98);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      Vector<double,_3U>::add(&local_170->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
    }
    if (this->b_is_Quadrupole == true) {
      this->pref = this->pre44_ * idat->electroMult;
      operator*((SquareMatrix3<double> *)&local_168,&idat->Q_1,&idat->Q_2);
      this_01 = &this->QaQb;
      RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)this_01,&local_168);
      this->trQaQb = (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[0][0] +
                     (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[1][1] +
                     (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[2][2];
      operator*((Vector<double,_3U> *)&local_168,&v1->super_Vector<double,_3U>,
                (RectMatrix<double,_3U,_3U> *)this_01);
      pVVar1 = &this->rQaQb;
      Vector3<double>::operator=(pVVar1,(Vector<double,_3U> *)&local_168);
      operator*((Vector<double,_3U> *)&local_168,(RectMatrix<double,_3U,_3U> *)this_01,
                &v1->super_Vector<double,_3U>);
      local_100 = &this->QaQbr;
      Vector3<double>::operator=(local_100,(Vector<double,_3U> *)&local_168);
      mCross<double,3u,3u>
                ((Vector<double,_3U> *)&local_168,(OpenMD *)&idat->Q_1,
                 (RectMatrix<double,_3U,_3U> *)&idat->Q_2,(RectMatrix<double,_3U,_3U> *)t2);
      local_178 = &this->QaxQb;
      Vector3<double>::operator=(local_178,(Vector<double,_3U> *)&local_168);
      pVVar2 = &this->rQa;
      pVVar3 = &this->Qbr;
      local_58 = pVVar2;
      local_50 = pVVar3;
      dVar13 = dot<double,3u>(&pVVar2->super_Vector<double,_3U>,&pVVar3->super_Vector<double,_3U>);
      this->rQaQbr = dVar13;
      cross<double>((Vector3<double> *)&local_168,pVVar2,pVVar3);
      pVVar2 = &this->rQaxQbr;
      Vector<double,_3U>::operator=
                (&pVVar2->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      this->U = this->rdQbr * this->rdQar * dVar13 * this->v43 +
                (this->rQaQbr * 4.0 + this->trQa * this->rdQbr + this->trQb * this->rdQar) * dVar13
                * this->v42 +
                (this->trQa * this->trQb + this->trQaQb + this->trQaQb) * dVar13 * this->v41 +
                this->U;
      operator*(&local_190,dVar13,&v1->super_Vector<double,_3U>);
      operator*(&local_1a8,&local_190,this->trQa * this->trQb + this->trQaQb + this->trQaQb);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->dv41);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      operator*(&local_190,this->pref,&v1->super_Vector<double,_3U>);
      operator*(&local_1a8,&local_190,
                this->rQaQbr * 4.0 + this->trQa * this->rdQbr + this->trQb * this->rdQar);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->dv42 - (this->v42or + this->v42or)
               );
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      operator*(&local_190,this->pref,&v1->super_Vector<double,_3U>);
      operator*(&local_1a8,&local_190,this->rdQar * this->rdQbr);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v43or * -4.0 + this->dv43);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      v1_00 = local_58;
      dVar13 = this->pref;
      operator*(&local_120,this->trQb,&local_58->super_Vector<double,_3U>);
      local_a0 = &this->rQb;
      operator*(&local_f8,this->trQa,&local_a0->super_Vector<double,_3U>);
      OpenMD::operator+(&local_190,&local_120,&local_f8);
      operator*(&local_1a8,dVar13 + dVar13,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v42or);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      OpenMD::operator+(&local_190,&pVVar1->super_Vector<double,_3U>,
                        &local_100->super_Vector<double,_3U>);
      operator*(&local_1a8,dVar13 * 4.0,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v42or);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      operator*(&local_120,&v1_00->super_Vector<double,_3U>,this->rdQbr);
      operator*(&local_f8,this->rdQar,&local_a0->super_Vector<double,_3U>);
      OpenMD::operator+(&local_190,&local_120,&local_f8);
      operator*(&local_1a8,dVar13 + dVar13,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v43or);
      Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      operator*(&local_190,-4.0,&local_178->super_Vector<double,_3U>);
      operator*(&local_1a8,&local_190,this->v41);
      operator*((Vector<double,_3U> *)&local_168,dVar13,&local_1a8);
      pVVar3 = local_108;
      Vector<double,_3U>::add(&local_108->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
      local_60 = this->pref;
      local_68 = this->trQb * -2.0;
      cross<double>((Vector3<double> *)&local_b8,v1_00,v1);
      operator*(&local_f8,local_68,&local_b8);
      cross<double>((Vector3<double> *)&local_80,v1,local_100);
      operator*(&local_98,4.0,&local_80);
      OpenMD::operator+(&local_120,&local_f8,&local_98);
      operator*(&local_48,4.0,&pVVar2->super_Vector<double,_3U>);
      operator-(&local_190,&local_120,&local_48);
      operator*(&local_1a8,local_60,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v42);
      Vector<double,_3U>::add(&pVVar3->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      local_100 = (Vector3d *)(this->pref + this->pref);
      cross<double>((Vector3<double> *)&local_120,v1,&this->Qar);
      operator*(&local_190,(double)local_100,&local_120);
      operator*(&local_1a8,&local_190,this->rdQbr);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v43);
      Vector<double,_3U>::add(&pVVar3->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      local_100 = (Vector3d *)this->pref;
      operator*(&local_190,4.0,&local_178->super_Vector<double,_3U>);
      operator*(&local_1a8,&local_190,this->v41);
      operator*((Vector<double,_3U> *)&local_168,(double)local_100,&local_1a8);
      Vector<double,_3U>::add(&local_170->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
      local_178 = (Vector3d *)this->pref;
      dVar13 = this->trQa;
      cross<double>((Vector3<double> *)&local_b8,local_a0,v1);
      operator*(&local_f8,dVar13 * -2.0,&local_b8);
      cross<double>((Vector3<double> *)&local_80,pVVar1,v1);
      operator*(&local_98,4.0,&local_80);
      operator-(&local_120,&local_f8,&local_98);
      operator*(&local_48,4.0,&pVVar2->super_Vector<double,_3U>);
      OpenMD::operator+(&local_190,&local_120,&local_48);
      pVVar1 = local_170;
      operator*(&local_1a8,(double)local_178,&local_190);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v42);
      Vector<double,_3U>::add(&pVVar1->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
      dVar13 = this->pref;
      cross<double>((Vector3<double> *)&local_120,v1,local_50);
      operator*(&local_190,dVar13 + dVar13,&local_120);
      operator*(&local_1a8,&local_190,this->rdQar);
      operator*((Vector<double,_3U> *)&local_168,&local_1a8,this->v43);
      Vector<double,_3U>::add(&pVVar1->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    }
  }
  if (idat->doElectricField == true) {
    operator*((Vector<double,_3U> *)&local_168,&local_d8->super_Vector<double,_3U>,idat->electroMult
             );
    Vector<double,_3U>::add
              (&(idat->eField1).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    operator*((Vector<double,_3U> *)&local_168,&local_d0->super_Vector<double,_3U>,idat->electroMult
             );
    Vector<double,_3U>::add
              (&(idat->eField2).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
  }
  if (idat->doSitePotential == true) {
    dVar13 = idat->electroMult * this->Pa + idat->sPot1;
    dVar6 = idat->electroMult * this->Pb + idat->sPot2;
    auVar7._8_4_ = SUB84(dVar6,0);
    auVar7._0_8_ = dVar13;
    auVar7._12_4_ = (int)((ulong)dVar6 >> 0x20);
    idat->sPot1 = dVar13;
    idat->sPot2 = (RealType)auVar7._8_8_;
  }
  if (this->a_is_Fluctuating == true) {
    idat->dVdFQ1 = this->dUdCa * idat->sw + idat->dVdFQ1;
  }
  if (this->b_is_Fluctuating == true) {
    idat->dVdFQ2 = this->dUdCb * idat->sw + idat->dVdFQ2;
  }
  if (idat->excluded == false) {
    dVar13 = this->U;
    idat->vpair = idat->vpair + dVar13;
    dVar6 = idat->sw;
    (idat->pot).data_[2] = dVar13 * dVar6 + (idat->pot).data_[2];
    if (idat->isSelected == true) {
      (idat->selePot).data_[2] = this->U * dVar6 + (idat->selePot).data_[2];
    }
    operator*((Vector<double,_3U> *)&local_168,&this_00->super_Vector<double,_3U>,dVar6);
    Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if ((this->a_is_Dipole != false) || (this->a_is_Quadrupole == true)) {
      operator*((Vector<double,_3U> *)&local_168,&local_108->super_Vector<double,_3U>,idat->sw);
      Vector<double,_3U>::add(&(idat->t1).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
    }
    if ((this->b_is_Dipole == false) && (this->b_is_Quadrupole != true)) {
      return;
    }
    operator*((Vector<double,_3U> *)&local_168,&local_170->super_Vector<double,_3U>,idat->sw);
  }
  else {
    idat->vpair = idat->vpair + this->indirect_Pot;
    (idat->excludedPot).data_[2] = this->excluded_Pot + (idat->excludedPot).data_[2];
    dVar13 = idat->sw;
    (idat->pot).data_[2] = this->indirect_Pot * dVar13 + (idat->pot).data_[2];
    if (idat->isSelected == true) {
      (idat->selePot).data_[2] = this->indirect_Pot * dVar13 + (idat->selePot).data_[2];
    }
    operator*((Vector<double,_3U> *)&local_168,dVar13,&local_e0->super_Vector<double,_3U>);
    Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
    if ((this->a_is_Dipole != false) || (this->a_is_Quadrupole == true)) {
      operator*((Vector<double,_3U> *)&local_168,idat->sw,&local_c8->super_Vector<double,_3U>);
      Vector<double,_3U>::add(&(idat->t1).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168)
      ;
    }
    if ((this->b_is_Dipole == false) && (this->b_is_Quadrupole != true)) {
      return;
    }
    operator*((Vector<double,_3U> *)&local_168,idat->sw,&local_c0->super_Vector<double,_3U>);
  }
  Vector<double,_3U>::add(&(idat->t2).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_168);
  return;
}

Assistant:

void Electrostatic::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    if (Etids[idat.atid1] != -1) {
      data1              = ElectrostaticMap[Etids[idat.atid1]];
      a_is_Charge        = data1.is_Charge;
      a_is_Dipole        = data1.is_Dipole;
      a_is_Quadrupole    = data1.is_Quadrupole;
      a_is_Fluctuating   = data1.is_Fluctuating;
      a_uses_SlaterIntra = data1.uses_SlaterIntramolecular;

    } else {
      a_is_Charge        = false;
      a_is_Dipole        = false;
      a_is_Quadrupole    = false;
      a_is_Fluctuating   = false;
      a_uses_SlaterIntra = false;
    }
    if (Etids[idat.atid2] != -1) {
      data2              = ElectrostaticMap[Etids[idat.atid2]];
      b_is_Charge        = data2.is_Charge;
      b_is_Dipole        = data2.is_Dipole;
      b_is_Quadrupole    = data2.is_Quadrupole;
      b_is_Fluctuating   = data2.is_Fluctuating;
      b_uses_SlaterIntra = data2.uses_SlaterIntramolecular;

    } else {
      b_is_Charge        = false;
      b_is_Dipole        = false;
      b_is_Quadrupole    = false;
      b_is_Fluctuating   = false;
      b_uses_SlaterIntra = false;
    }

    U = 0.0;      // Potential
    F.zero();     // Force
    Ta.zero();    // Torque on site a
    Tb.zero();    // Torque on site b
    Ea.zero();    // Electric field at site a
    Eb.zero();    // Electric field at site b
    Pa    = 0.0;  // Site potential at site a
    Pb    = 0.0;  // Site potential at site b
    dUdCa = 0.0;  // fluctuating charge force at site a
    dUdCb = 0.0;  // fluctuating charge force at site a

    // Indirect interactions mediated by the reaction field.
    indirect_Pot = 0.0;  // Potential
    indirect_F.zero();   // Force
    indirect_Ta.zero();  // Torque on site a
    indirect_Tb.zero();  // Torque on site b

    // Excluded potential that is still computed for fluctuating charges
    excluded_Pot = 0.0;

    // some variables we'll need independent of electrostatic type:

    ri   = 1.0 / idat.rij;
    rhat = idat.d * ri;

    // Obtain all of the required radial function values from the
    // spline structures:

    if (((a_uses_SlaterIntra || b_uses_SlaterIntra) && idat.excluded)) {
      J = Jij[FQtids[idat.atid1]][FQtids[idat.atid2]];
    }

    // needed for fields (and forces):
    if (a_is_Charge || b_is_Charge) {
      v01s->getValueAndDerivativeAt(idat.rij, v01, dv01);
    }
    if (a_is_Dipole || b_is_Dipole) {
      v11s->getValueAndDerivativeAt(idat.rij, v11, dv11);
      v11or = ri * v11;
    }
    if (a_is_Quadrupole || b_is_Quadrupole || (a_is_Dipole && b_is_Dipole)) {
      v21s->getValueAndDerivativeAt(idat.rij, v21, dv21);
      v22s->getValueAndDerivativeAt(idat.rij, v22, dv22);
      v22or = ri * v22;
    }

    // needed for potentials (and forces and torques):
    if ((a_is_Dipole && b_is_Quadrupole) || (b_is_Dipole && a_is_Quadrupole)) {
      v31s->getValueAndDerivativeAt(idat.rij, v31, dv31);
      v32s->getValueAndDerivativeAt(idat.rij, v32, dv32);
      v31or = v31 * ri;
      v32or = v32 * ri;
    }
    if (a_is_Quadrupole && b_is_Quadrupole) {
      v41s->getValueAndDerivativeAt(idat.rij, v41, dv41);
      v42s->getValueAndDerivativeAt(idat.rij, v42, dv42);
      v43s->getValueAndDerivativeAt(idat.rij, v43, dv43);
      v42or = v42 * ri;
      v43or = v43 * ri;
    }

    // calculate the single-site contributions (fields, etc).

    if (a_is_Charge) {
      C_a = data1.fixedCharge;

      if (a_is_Fluctuating) { C_a += idat.flucQ1; }

      if (idat.excluded) {
        idat.skippedCharge2 += C_a;
      } else {
        // only do the field and site potentials if we're not excluded:
        Eb -= C_a * pre11_ * dv01 * rhat;
        Pb += C_a * pre11_ * v01;
      }
    }

    if (a_is_Dipole) {
      rdDa = dot(rhat, idat.D_1);
      rxDa = cross(rhat, idat.D_1);
      if (!idat.excluded) {
        Eb -= pre12_ * ((dv11 - v11or) * rdDa * rhat + v11or * idat.D_1);
        Pb += pre12_ * v11 * rdDa;
      }
    }

    if (a_is_Quadrupole) {
      trQa  = idat.Q_1.trace();
      Qar   = idat.Q_1 * rhat;
      rQa   = rhat * idat.Q_1;
      rdQar = dot(rhat, Qar);
      rxQar = cross(rhat, Qar);
      if (!idat.excluded) {
        Eb -= pre14_ * (trQa * rhat * dv21 + 2.0 * Qar * v22or +
                        rdQar * rhat * (dv22 - 2.0 * v22or));
        Pb += pre14_ * (v21 * trQa + v22 * rdQar);
      }
    }

    if (b_is_Charge) {
      C_b = data2.fixedCharge;

      if (b_is_Fluctuating) { C_b += idat.flucQ2; }

      if (idat.excluded) {
        idat.skippedCharge1 += C_b;
      } else {
        // only do the field if we're not excluded:
        Ea += C_b * pre11_ * dv01 * rhat;
        Pa += C_b * pre11_ * v01;
      }
    }

    if (b_is_Dipole) {
      rdDb = dot(rhat, idat.D_2);
      rxDb = cross(rhat, idat.D_2);
      if (!idat.excluded) {
        Ea += pre12_ * ((dv11 - v11or) * rdDb * rhat + v11or * idat.D_2);
        Pa += pre12_ * v11 * rdDb;
      }
    }

    if (b_is_Quadrupole) {
      trQb  = idat.Q_2.trace();
      Qbr   = idat.Q_2 * rhat;
      rQb   = rhat * idat.Q_2;
      rdQbr = dot(rhat, Qbr);
      rxQbr = cross(rhat, Qbr);
      if (!idat.excluded) {
        Ea += pre14_ * (trQb * rhat * dv21 + 2.0 * Qbr * v22or +
                        rdQbr * rhat * (dv22 - 2.0 * v22or));
        Pa += pre14_ * (v21 * trQb + v22 * rdQbr);
      }
    }

    if (a_is_Charge) {
      if (b_is_Charge) {
        pref = pre11_ * idat.electroMult;
        U += C_a * C_b * pref * v01;
        F += C_a * C_b * pref * dv01 * rhat;

        // If this is an excluded pair, there are still indirect
        // interactions via the reaction field we must worry about:

        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = preRF_ * pref * C_a * C_b * idat.r2;
          indirect_Pot += rfContrib;
          indirect_F += rfContrib * 2.0 * ri * rhat;
        }

        // Fluctuating charge forces are handled via Coulomb integrals
        // for excluded pairs (i.e. those connected via bonds) and
        // with the standard charge-charge interaction otherwise.

        if (idat.excluded) {
          if (a_uses_SlaterIntra || b_uses_SlaterIntra) {
            coulInt = J->getValueAt(idat.rij);
            excluded_Pot += C_a * C_b * coulInt;
            if (a_is_Fluctuating) dUdCa += C_b * coulInt;
            if (b_is_Fluctuating) dUdCb += C_a * coulInt;
          }
        } else {
          if (a_is_Fluctuating) dUdCa += C_b * pref * v01;
          if (b_is_Fluctuating) dUdCb += C_a * pref * v01;
        }
      }

      if (b_is_Dipole) {
        pref = pre12_ * idat.electroMult;
        U += C_a * pref * v11 * rdDb;
        F += C_a * pref * ((dv11 - v11or) * rdDb * rhat + v11or * idat.D_2);
        Tb += C_a * pref * v11 * rxDb;

        if (a_is_Fluctuating) dUdCa += pref * v11 * rdDb;

        // Even if we excluded this pair from direct interactions, we
        // still have the reaction-field-mediated charge-dipole
        // interaction:

        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = C_a * pref * preRF_ * 2.0 * idat.rij;
          indirect_Pot += rfContrib * rdDb;
          indirect_F += rfContrib * idat.D_2 / idat.rij;
          indirect_Tb += C_a * pref * preRF_ * rxDb;
        }
      }

      if (b_is_Quadrupole) {
        pref = pre14_ * idat.electroMult;
        U += C_a * pref * (v21 * trQb + v22 * rdQbr);
        F += C_a * pref * (trQb * dv21 * rhat + 2.0 * Qbr * v22or);
        F += C_a * pref * rdQbr * rhat * (dv22 - 2.0 * v22or);
        Tb += C_a * pref * 2.0 * rxQbr * v22;

        if (a_is_Fluctuating) dUdCa += pref * (v21 * trQb + v22 * rdQbr);
      }
    }

    if (a_is_Dipole) {
      if (b_is_Charge) {
        pref = pre12_ * idat.electroMult;

        U -= C_b * pref * v11 * rdDa;
        F -= C_b * pref * ((dv11 - v11or) * rdDa * rhat + v11or * idat.D_1);
        Ta -= C_b * pref * v11 * rxDa;

        if (b_is_Fluctuating) dUdCb -= pref * v11 * rdDa;

        // Even if we excluded this pair from direct interactions,
        // we still have the reaction-field-mediated charge-dipole
        // interaction:
        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = C_b * pref * preRF_ * 2.0 * idat.rij;
          indirect_Pot -= rfContrib * rdDa;
          indirect_F -= rfContrib * idat.D_1 / idat.rij;
          indirect_Ta -= C_b * pref * preRF_ * rxDa;
        }
      }

      if (b_is_Dipole) {
        pref  = pre22_ * idat.electroMult;
        DadDb = dot(idat.D_1, idat.D_2);
        DaxDb = cross(idat.D_1, idat.D_2);

        U -= pref * (DadDb * v21 + rdDa * rdDb * v22);
        F -= pref * (dv21 * DadDb * rhat +
                     v22or * (rdDb * idat.D_1 + rdDa * idat.D_2));
        F -= pref * (rdDa * rdDb) * (dv22 - 2.0 * v22or) * rhat;
        Ta += pref * (v21 * DaxDb - v22 * rdDb * rxDa);
        Tb += pref * (-v21 * DaxDb - v22 * rdDa * rxDb);
        // Even if we excluded this pair from direct interactions, we
        // still have the reaction-field-mediated dipole-dipole
        // interaction:
        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = -pref * preRF_ * 2.0;
          indirect_Pot += rfContrib * DadDb;
          indirect_Ta += rfContrib * DaxDb;
          indirect_Tb -= rfContrib * DaxDb;
        }
      }

      if (b_is_Quadrupole) {
        pref   = pre24_ * idat.electroMult;
        DadQb  = idat.D_1 * idat.Q_2;
        DadQbr = dot(idat.D_1, Qbr);
        DaxQbr = cross(idat.D_1, Qbr);

        U -= pref * ((trQb * rdDa + 2.0 * DadQbr) * v31 + rdDa * rdQbr * v32);
        F -= pref * (trQb * idat.D_1 + 2.0 * DadQb) * v31or;
        F -= pref * (trQb * rdDa + 2.0 * DadQbr) * (dv31 - v31or) * rhat;
        F -= pref * (idat.D_1 * rdQbr + 2.0 * rdDa * rQb) * v32or;
        F -= pref * (rdDa * rdQbr * rhat * (dv32 - 3.0 * v32or));
        Ta += pref * ((-trQb * rxDa + 2.0 * DaxQbr) * v31 - rxDa * rdQbr * v32);
        Tb += pref * ((2.0 * cross(DadQb, rhat) - 2.0 * DaxQbr) * v31 -
                      2.0 * rdDa * rxQbr * v32);
      }
    }

    if (a_is_Quadrupole) {
      if (b_is_Charge) {
        pref = pre14_ * idat.electroMult;
        U += C_b * pref * (v21 * trQa + v22 * rdQar);
        F += C_b * pref * (trQa * rhat * dv21 + 2.0 * Qar * v22or);
        F += C_b * pref * rdQar * rhat * (dv22 - 2.0 * v22or);
        Ta += C_b * pref * 2.0 * rxQar * v22;

        if (b_is_Fluctuating) dUdCb += pref * (v21 * trQa + v22 * rdQar);
      }
      if (b_is_Dipole) {
        pref   = pre24_ * idat.electroMult;
        DbdQa  = idat.D_2 * idat.Q_1;
        DbdQar = dot(idat.D_2, Qar);
        DbxQar = cross(idat.D_2, Qar);

        U += pref * ((trQa * rdDb + 2.0 * DbdQar) * v31 + rdDb * rdQar * v32);
        F += pref * (trQa * idat.D_2 + 2.0 * DbdQa) * v31or;
        F += pref * (trQa * rdDb + 2.0 * DbdQar) * (dv31 - v31or) * rhat;
        F += pref * (idat.D_2 * rdQar + 2.0 * rdDb * rQa) * v32or;
        F += pref * (rdDb * rdQar * rhat * (dv32 - 3.0 * v32or));
        Ta += pref * ((-2.0 * cross(DbdQa, rhat) + 2.0 * DbxQar) * v31 +
                      2.0 * rdDb * rxQar * v32);
        Tb += pref * ((trQa * rxDb - 2.0 * DbxQar) * v31 + rxDb * rdQar * v32);
      }
      if (b_is_Quadrupole) {
        pref    = pre44_ * idat.electroMult;  // yes
        QaQb    = idat.Q_1 * idat.Q_2;
        trQaQb  = QaQb.trace();
        rQaQb   = rhat * QaQb;
        QaQbr   = QaQb * rhat;
        QaxQb   = mCross(idat.Q_1, idat.Q_2);
        rQaQbr  = dot(rQa, Qbr);
        rQaxQbr = cross(rQa, Qbr);

        U += pref * (trQa * trQb + 2.0 * trQaQb) * v41;
        U += pref * (trQa * rdQbr + trQb * rdQar + 4.0 * rQaQbr) * v42;
        U += pref * (rdQar * rdQbr) * v43;

        F += pref * rhat * (trQa * trQb + 2.0 * trQaQb) * dv41;
        F += pref * rhat * (trQa * rdQbr + trQb * rdQar + 4.0 * rQaQbr) *
             (dv42 - 2.0 * v42or);
        F += pref * rhat * (rdQar * rdQbr) * (dv43 - 4.0 * v43or);

        F += pref * 2.0 * (trQb * rQa + trQa * rQb) * v42or;
        F += pref * 4.0 * (rQaQb + QaQbr) * v42or;
        F += pref * 2.0 * (rQa * rdQbr + rdQar * rQb) * v43or;

        Ta += pref * (-4.0 * QaxQb * v41);
        Ta += pref *
              (-2.0 * trQb * cross(rQa, rhat) + 4.0 * cross(rhat, QaQbr) -
               4.0 * rQaxQbr) *
              v42;
        Ta += pref * 2.0 * cross(rhat, Qar) * rdQbr * v43;

        Tb += pref * (+4.0 * QaxQb * v41);
        Tb += pref *
              (-2.0 * trQa * cross(rQb, rhat) - 4.0 * cross(rQaQb, rhat) +
               4.0 * rQaxQbr) *
              v42;
        // Possible replacement for line 2 above:
        //             + 4.0 * cross(rhat, QbQar)

        Tb += pref * 2.0 * cross(rhat, Qbr) * rdQar * v43;
      }
    }

    if (idat.doElectricField) {
      idat.eField1 += Ea * idat.electroMult;
      idat.eField2 += Eb * idat.electroMult;
    }

    if (idat.doSitePotential) {
      idat.sPot1 += Pa * idat.electroMult;
      idat.sPot2 += Pb * idat.electroMult;
    }

    if (a_is_Fluctuating) idat.dVdFQ1 += dUdCa * idat.sw;
    if (b_is_Fluctuating) idat.dVdFQ2 += dUdCb * idat.sw;

    if (!idat.excluded) {
      idat.vpair += U;
      idat.pot[ELECTROSTATIC_FAMILY] += U * idat.sw;
      if (idat.isSelected) idat.selePot[ELECTROSTATIC_FAMILY] += U * idat.sw;

      idat.f1 += F * idat.sw;

      if (a_is_Dipole || a_is_Quadrupole) idat.t1 += Ta * idat.sw;

      if (b_is_Dipole || b_is_Quadrupole) idat.t2 += Tb * idat.sw;

    } else {
      // only accumulate the forces and torques resulting from the
      // indirect reaction field terms.

      idat.vpair += indirect_Pot;
      idat.excludedPot[ELECTROSTATIC_FAMILY] += excluded_Pot;
      idat.pot[ELECTROSTATIC_FAMILY] += idat.sw * indirect_Pot;
      if (idat.isSelected)
        idat.selePot[ELECTROSTATIC_FAMILY] += idat.sw * indirect_Pot;

      idat.f1 += idat.sw * indirect_F;

      if (a_is_Dipole || a_is_Quadrupole) idat.t1 += idat.sw * indirect_Ta;

      if (b_is_Dipole || b_is_Quadrupole) idat.t2 += idat.sw * indirect_Tb;
    }
    return;
  }